

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestMultiplyUInt64(void)

{
  Bignum bignum;
  char buffer [1024];
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  Bignum *in_stack_fffffffffffff9f0;
  Chunk in_stack_fffffffffffff9f8;
  undefined2 in_stack_fffffffffffff9fc;
  uint16_t in_stack_fffffffffffff9fe;
  Bignum *in_stack_fffffffffffffa00;
  Chunk in_stack_fffffffffffffa08;
  Chunk in_stack_fffffffffffffa0c;
  Bignum *in_stack_fffffffffffffa10;
  Chunk in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  Bignum *in_stack_fffffffffffffa28;
  uint64_t in_stack_fffffffffffffa48;
  Bignum *in_stack_fffffffffffffa50;
  
  double_conversion::Bignum::Bignum((Bignum *)&stack0xfffffffffffff9f4);
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignHexString(in_stack_fffffffffffffa10,
                  (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa00,in_stack_fffffffffffff9fe);
  double_conversion::Bignum::ShiftLeft(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  AssignDecimalString(in_stack_fffffffffffffa10,
                      (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  double_conversion::Bignum::MultiplyByUInt64(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c);
  CheckHelper((char *)in_stack_fffffffffffffa00,
              CONCAT22(in_stack_fffffffffffff9fe,in_stack_fffffffffffff9fc),
              (char *)in_stack_fffffffffffff9f0,SUB41((uint)in_stack_fffffffffffff9ec >> 0x18,0));
  CheckEqualsHelper((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,
                    (char *)in_stack_fffffffffffffa00,
                    (char *)CONCAT26(in_stack_fffffffffffff9fe,
                                     CONCAT24(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8)),
                    (char *)in_stack_fffffffffffff9f0,
                    (char *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  return;
}

Assistant:

TEST(MultiplyUInt64) {
  char buffer[kBufferSize];
  Bignum bignum;

  AssignHexString(&bignum, "0");
  bignum.MultiplyByUInt64(0x25);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("0", buffer);

  AssignHexString(&bignum, "2");
  bignum.MultiplyByUInt64(0x5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  AssignHexString(&bignum, "10000000");
  bignum.MultiplyByUInt64(0x9);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("90000000", buffer);

  AssignHexString(&bignum, "100000000000000");
  bignum.MultiplyByUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFF00000000000000", buffer);

  AssignHexString(&bignum, "100000000000000");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFF00000000000000", buffer);

  AssignHexString(&bignum, "1234567ABCD");
  bignum.MultiplyByUInt64(0xFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("12333335552433", buffer);

  AssignHexString(&bignum, "1234567ABCD");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1234567ABCBDCBA985433", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0x2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1FFFFFFFFFFFFFFFE", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0x4);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("3FFFFFFFFFFFFFFFC", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(0xF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("EFFFFFFFFFFFFFFF1", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFF");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFFFE0000000000000001", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  // "10 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("20000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  // "10 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("F0000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFE00010000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(0xFFFFFFFF);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFEFFFF00010000000000000000000000000", buffer);

  bignum.AssignUInt16(0xFFFF);
  bignum.ShiftLeft(100);
  // "FFFF0 0000 0000 0000 0000 0000 0000"
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFEFFFFFFFFFFFF00010000000000000000000000000", buffer);

  AssignDecimalString(&bignum, "15611230384529777");
  bignum.MultiplyByUInt64(DOUBLE_CONVERSION_UINT64_2PART_C(0x8ac72304, 89e80000));
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1E10EE4B11D15A7F3DE7F3C7680000", buffer);
}